

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int gmatch_aux(lua_State *L)

{
  int iVar1;
  char *pcVar2;
  char *p_00;
  lua_Integer lVar3;
  char *e_00;
  lua_Integer local_280;
  lua_Integer newstart;
  char *e;
  char *src;
  char *p;
  char *s;
  size_t lp;
  size_t ls;
  MatchState ms;
  lua_State *L_local;
  
  ms.capture[0x1f].len = (ptrdiff_t)L;
  pcVar2 = lua_tolstring(L,-0xf4629,&lp);
  p_00 = lua_tolstring((lua_State *)ms.capture[0x1f].len,-0xf462a,(size_t *)&s);
  ms.p_end = (char *)ms.capture[0x1f].len;
  ls._0_4_ = 200;
  ms.src_init = pcVar2 + lp;
  ms.src_end = p_00 + (long)s;
  ms._0_8_ = pcVar2;
  lVar3 = lua_tointegerx((lua_State *)ms.capture[0x1f].len,-0xf462b,(int *)0x0);
  e = pcVar2 + lVar3;
  while( true ) {
    if (ms.src_init < e) {
      return 0;
    }
    ms.L._0_4_ = 0;
    e_00 = match((MatchState *)&ls,e,p_00);
    if (e_00 != (char *)0x0) break;
    e = e + 1;
  }
  local_280 = (long)e_00 - (long)pcVar2;
  if (e_00 == e) {
    local_280 = local_280 + 1;
  }
  lua_pushinteger((lua_State *)ms.capture[0x1f].len,local_280);
  lua_replace((lua_State *)ms.capture[0x1f].len,-0xf462b);
  iVar1 = push_captures((MatchState *)&ls,e,e_00);
  return iVar1;
}

Assistant:

static int gmatch_aux (lua_State *L) {
  MatchState ms;
  size_t ls, lp;
  const char *s = lua_tolstring(L, lua_upvalueindex(1), &ls);
  const char *p = lua_tolstring(L, lua_upvalueindex(2), &lp);
  const char *src;
  ms.L = L;
  ms.matchdepth = MAXCCALLS;
  ms.src_init = s;
  ms.src_end = s+ls;
  ms.p_end = p + lp;
  for (src = s + (size_t)lua_tointeger(L, lua_upvalueindex(3));
       src <= ms.src_end;
       src++) {
    const char *e;
    ms.level = 0;
    lua_assert(ms.matchdepth == MAXCCALLS);
    if ((e = match(&ms, src, p)) != NULL) {
      lua_Integer newstart = e-s;
      if (e == src) newstart++;  /* empty match? go at least one position */
      lua_pushinteger(L, newstart);
      lua_replace(L, lua_upvalueindex(3));
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}